

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MauProxy.cpp
# Opt level: O0

void __thiscall mau::DeliveryChannel::InsertQueueNode(DeliveryChannel *this,QueueNode *node)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint64_t uVar5;
  uint8_t *puVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  Allocator *this_00;
  DeliveryChannel *in_RSI;
  long in_RDI;
  bool bVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 in_ZMM0 [64];
  QueueNode *dupeNode;
  uint8_t *readBuffer;
  Locker locker_4;
  float lossRate;
  uint range;
  uint reorderMsec;
  float reorderRate;
  float red_plr;
  float queueFraction;
  uint64_t deliveryUsec;
  uint dataDelayUsec;
  uint64_t routerQueueStartUsec;
  uint routerQueueUsec;
  uint64_t nowUsec;
  Locker locker;
  bool dupe;
  MauChannelConfig config;
  Locker locker_3;
  Locker locker_2;
  Locker locker_1;
  Locker locker_5;
  Lock *in_stack_fffffffffffffe08;
  Locker *in_stack_fffffffffffffe10;
  LockedValue<MauChannelConfig_t> *in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe44;
  Allocator *in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe50;
  uint32_t in_stack_fffffffffffffe54;
  DeliveryChannel *in_stack_fffffffffffffe70;
  float local_144;
  int local_13c;
  float local_138;
  float local_12c;
  _Head_base<0UL,_asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_*,_false>
  local_128;
  float local_e8;
  float local_e4;
  float local_e0;
  int local_dc;
  float local_d4;
  float local_d0;
  int local_cc;
  int local_c8;
  int local_c4;
  float local_c0;
  float local_bc;
  float in_stack_ffffffffffffff48;
  float in_stack_ffffffffffffff4c;
  
  auVar11 = in_ZMM0._0_16_;
  LockedValue<MauChannelConfig_t>::Get(in_stack_fffffffffffffe20);
  bVar10 = false;
  Locker::Locker(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  uVar5 = GetTimeUsec();
  uVar9 = uVar5 + (uint)(local_cc * 1000);
  auVar11 = vcvtusi2ss_avx512f(auVar11,(in_RSI->DeliveryAddress).TheLock.cs.
                                       super___recursive_mutex_base._M_mutex.__data.__owner);
  auVar12._0_4_ = auVar11._0_4_ / local_e0;
  auVar12._4_12_ = auVar11._4_12_;
  uVar7 = vcvttss2usi_avx512f(auVar12);
  local_12c = 0.0;
  if (*(ulong *)(in_RDI + 200) < uVar9) {
    local_128._M_head_impl =
         (basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
          *)(uVar9 + uVar7);
  }
  else {
    local_128._M_head_impl =
         (basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
          *)(*(long *)(in_RDI + 200) + (ulong)uVar7);
    if ((basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
         *)(uVar9 + (uint)(local_dc * 1000)) <= local_128._M_head_impl) {
      Locker::Locker(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
      pktalloc::Allocator::Free
                (in_stack_fffffffffffffe48,
                 (uint8_t *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
      uVar7 = (uint)((ulong)in_stack_fffffffffffffe48 >> 0x20);
      Locker::~Locker((Locker *)0x26776a);
      bVar1 = true;
      goto LAB_00267c88;
    }
    auVar12 = vcvtusi2ss_avx512f((undefined1  [16])0x0,(long)local_128._M_head_impl - uVar9);
    auVar11 = vcvtusi2ss_avx512f(ZEXT416((uint)local_e0),local_dc * 1000);
    local_12c = auVar12._0_4_ / auVar11._0_4_;
  }
  if (((local_d4 != 0.0) || (NAN(local_d4))) && (local_d4 < local_12c)) {
    in_stack_fffffffffffffe54 = PCGRandom::Next((PCGRandom *)(in_RDI + 0xd0));
    uVar7 = vcvttss2usi_avx512f(ZEXT416((uint)(((local_d0 * (local_12c - local_d4)) /
                                               (1.0 - local_d4)) * 4.2949673e+09)));
    if (in_stack_fffffffffffffe54 < uVar7) {
      this_00 = (Allocator *)(*(long *)(in_RDI + 8) + 0x70);
      Locker::Locker(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
      pktalloc::Allocator::Free
                (this_00,(uint8_t *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
      uVar7 = (uint)((ulong)this_00 >> 0x20);
      Locker::~Locker((Locker *)0x2678fb);
      bVar1 = true;
      goto LAB_00267c88;
    }
  }
  uVar2 = PCGRandom::Next((PCGRandom *)(in_RDI + 0xd0));
  uVar7 = vcvttss2usi_avx512f(ZEXT416((uint)(in_stack_ffffffffffffff48 * 4.2949673e+09)));
  bVar10 = uVar2 < uVar7;
  if ((*(byte *)(in_RDI + 0xc1) & 1) == 0) {
    local_138 = local_c0;
  }
  else {
    local_138 = 1.0 - local_bc;
  }
  local_13c = 0;
  uVar3 = PCGRandom::Next((PCGRandom *)(in_RDI + 0xd0));
  uVar7 = vcvttss2usi_avx512f(ZEXT416((uint)(local_138 * 4.2949673e+09)));
  if (uVar3 < uVar7) {
    *(undefined1 *)(in_RDI + 0xc1) = 1;
    local_13c = local_c8;
    if (local_c4 - local_c8 != 0) {
      uVar4 = PCGRandom::Next((PCGRandom *)(in_RDI + 0xd0));
      local_13c = uVar4 % (uint)(local_c4 - local_c8) + local_c8;
    }
  }
  else {
    *(undefined1 *)(in_RDI + 0xc1) = 0;
  }
  if ((*(byte *)(in_RDI + 0xc0) & 1) == 0) {
    local_144 = local_e8;
  }
  else {
    local_144 = 1.0 - local_e4;
  }
  uVar4 = PCGRandom::Next((PCGRandom *)(in_RDI + 0xd0));
  uVar7 = vcvttss2usi_avx512f(ZEXT416((uint)(local_144 * 4.2949673e+09)));
  if (uVar4 < uVar7) {
    *(undefined1 *)(in_RDI + 0xc0) = 1;
    Locker::Locker(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
    pktalloc::Allocator::Free(in_stack_fffffffffffffe48,(uint8_t *)CONCAT44(uVar2,uVar3));
    uVar7 = (uint)((ulong)in_stack_fffffffffffffe48 >> 0x20);
    Locker::~Locker((Locker *)0x267b89);
    bVar1 = true;
  }
  else {
    *(undefined1 *)(in_RDI + 0xc0) = 0;
    uVar2 = PCGRandom::Next((PCGRandom *)(in_RDI + 0xd0));
    uVar7 = (uint)((ulong)in_stack_fffffffffffffe48 >> 0x20);
    uVar8 = vcvttss2usi_avx512f(ZEXT416((uint)(in_stack_ffffffffffffff4c * 4.2949673e+09)));
    if (uVar2 < uVar8) {
      puVar6 = (uint8_t *)
               ((in_RSI->DeliveryAddress).TheLock.cs.super___recursive_mutex_base._M_mutex.__size +
               0xc);
      uVar2 = PCGRandom::Next((PCGRandom *)(in_RDI + 0xd0));
      uVar9 = (ulong)uVar2 %
              (ulong)(uint)(in_RSI->DeliveryAddress).TheLock.cs.super___recursive_mutex_base.
                           _M_mutex.__data.__owner;
      puVar6[uVar9] = puVar6[uVar9] ^ 8;
    }
    if (local_13c == 0) {
      *(basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
        **)(in_RDI + 200) = local_128._M_head_impl;
    }
    else {
      local_128._M_head_impl =
           (basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
            *)((long)&((local_128._M_head_impl)->
                      super_basic_io_object<asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>,_true>
                      ).service_ + (ulong)(uint)(local_13c * 1000));
    }
    (in_RSI->DeliveryTimer)._M_t.
    super___uniq_ptr_impl<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_*,_std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>_>
    .
    super__Head_base<0UL,_asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_*,_false>
    ._M_head_impl = local_128._M_head_impl;
    bVar1 = false;
  }
LAB_00267c88:
  Locker::~Locker((Locker *)0x267c95);
  if (!bVar1) {
    Locker::Locker(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
    PacketQueue::InsertSorted((PacketQueue *)(in_RDI + 0x80),(QueueNode *)in_RSI);
    Locker::~Locker((Locker *)0x267ce9);
    if (bVar10) {
      Locker::Locker((Locker *)(*(long *)(in_RDI + 8) + 0x70),in_stack_fffffffffffffe08);
      puVar6 = pktalloc::Allocator::Allocate
                         ((Allocator *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50)
                          ,uVar7);
      Locker::~Locker((Locker *)0x267d99);
      *(int *)(puVar6 + 0x18) =
           (in_RSI->DeliveryAddress).TheLock.cs.super___recursive_mutex_base._M_mutex.__data.__owner
      ;
      memcpy(puVar6 + 0x1c,
             (uint8_t *)
             ((long)&(in_RSI->DeliveryAddress).TheLock.cs.super___recursive_mutex_base._M_mutex +
             0xc),(ulong)(uint)(in_RSI->DeliveryAddress).TheLock.cs.super___recursive_mutex_base.
                               _M_mutex.__data.__owner);
      InsertQueueNode(in_RSI,(QueueNode *)
                             CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    }
    postNextTimer(in_stack_fffffffffffffe70);
  }
  return;
}

Assistant:

void DeliveryChannel::InsertQueueNode(QueueNode* node)
{
    /*
        Client <-> Internet Delay <-> ISP Router Queue <-> Server

        Most queues are going to be on the receiver ISP side, for example
        on the cellphone network or cable ISP.  The Internet transmission
        delay comes before that.  Since this is the most common case for
        the protocols we are testing, we use the simplified model above.

        In this model, packets put into the queue are subjected to:
        (1) Internet Delay
        (2) ISP Router Queue

        The Internet Delay may vary on route changes.

        The Internet Service Provider (ISP) Router Queue causes
        delays and packet loss if the queue is too full.
    */

    MauChannelConfig config = Common->ChannelConfig.Get();
    bool dupe = false;

    // Hold InsertLock while processing insert
    {
        Locker locker(InsertLock);

        const uint64_t nowUsec = GetTimeUsec();

        const unsigned routerQueueUsec = config.Router_QueueMsec * 1000;
        const uint64_t routerQueueStartUsec = nowUsec + config.LightSpeedMsec * 1000;
        const unsigned dataDelayUsec = (unsigned)(node->Bytes / config.Router_MBPS);

        uint64_t deliveryUsec = 0;
        float queueFraction = 0.f;

        // Calculate delivery time based on router queue
        if (NextQueueSlotUsec < routerQueueStartUsec) {
            deliveryUsec = routerQueueStartUsec + dataDelayUsec;
        }
        else {
            deliveryUsec = NextQueueSlotUsec + dataDelayUsec;

            // DropTail if packet does not fit in router queue
            if (deliveryUsec >= routerQueueStartUsec + routerQueueUsec) {
                Common->ReadBufferAllocator.Free(node);
                return;
            }

            queueFraction = (deliveryUsec - routerQueueStartUsec) / (float)routerQueueUsec;
        }

        // If RED is triggered:
        if (config.Router_RED_QueueFraction != 0.f && queueFraction > config.Router_RED_QueueFraction)
        {
            // Rescale:
            const float red_plr = config.Router_RED_MaxPLR * (queueFraction - config.Router_RED_QueueFraction) / (1.f - config.Router_RED_QueueFraction);

            // If RED drop is needed:
            if (LossRNG.Next() < (uint32_t)(0xffffffff * red_plr)) {
                Common->ReadBufferAllocator.Free(node);
                return;
            }
        }

        // If duplicating:
        if (LossRNG.Next() < (uint32_t)(0xffffffff * config.DuplicateRate)) {
            dupe = true;
        }

        float reorderRate;
        if (InBurstReorder) {
            reorderRate = 1.f - config.OrderRate;
        }
        else {
            reorderRate = config.ReorderRate;
        }

        // If this packet will be reordered:
        unsigned reorderMsec = 0;
        if (LossRNG.Next() < (uint32_t)(0xffffffff * reorderRate))
        {
            InBurstReorder = true;
            reorderMsec = config.ReorderMinimumLatencyMsec;
            const unsigned range = config.ReorderMaximumLatencyMsec - config.ReorderMinimumLatencyMsec;
            if (range > 0) {
                reorderMsec += LossRNG.Next() % range;
            }
        }
        else {
            InBurstReorder = false;
        }

        // Select loss rate for this packet due to Gilbert-Elliott channel model
        float lossRate;
        if (InBurstLoss) {
            lossRate = 1.f - config.DeliveryRate;
        }
        else {
            lossRate = config.LossRate;
        }

        // If this packet will be lost:
        if (LossRNG.Next() < (uint32_t)(0xffffffff * lossRate)) {
            InBurstLoss = true;
            Common->ReadBufferAllocator.Free(node);
            return;
        }
        InBurstLoss = false; // Burst loss is done

        // If this packet will be corrupted:
        if (LossRNG.Next() < (uint32_t)(0xffffffff * config.CorruptionRate)) {
            node->Data[LossRNG.Next() % node->Bytes] ^= 8;
        }

        // If re-ordered:
        if (reorderMsec > 0) {
            // Add reorder time to it
            // Note: Bypasses queue so will not be counted towards channel bandwidth
            deliveryUsec += reorderMsec * 1000;
        }
        else {
            // It takes up a queue slot, so advance the queue
            NextQueueSlotUsec = deliveryUsec;
        }

        node->DeliveryUsec = deliveryUsec;
    }

    // Hold QueueLock during queue insert
    {
        Locker locker(QueueLock);
        Queue.InsertSorted(node);
    }

    if (dupe)
    {
        // Allocate space for the duplicate
        uint8_t* readBuffer = Common->ReadBufferAllocator.Allocate(kQueueHeaderSize + node->Bytes);

        QueueNode* dupeNode = reinterpret_cast<QueueNode*>(readBuffer);

        // Copy the data
        dupeNode->Bytes = node->Bytes;
        memcpy(&dupeNode->Data[0], &node->Data[0], node->Bytes);

        InsertQueueNode(dupeNode);
    }

    postNextTimer();
}